

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O0

bool CorUnix::MTX_InternalTryEnterCriticalSection
               (CPalThread *pThread,PCRITICAL_SECTION pCriticalSection)

{
  PalCsInitState PVar1;
  int iVar2;
  HANDLE pVVar3;
  SIZE_T threadId;
  bool fRet;
  PAL_CRITICAL_SECTION *pPalCriticalSection;
  PCRITICAL_SECTION pCriticalSection_local;
  CPalThread *pThread_local;
  
  PVar1 = ::Volatile::operator_cast_to_PalCsInitState((Volatile *)&pCriticalSection->dwInitState);
  if (PVar1 == PalCsNotInitialized) {
    fprintf(_stderr,"] %s %s:%d","MTX_InternalTryEnterCriticalSection",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
            ,0x62b);
    fprintf(_stderr,"Expression: PalCsNotInitialized != pPalCriticalSection->cisInitState\n");
  }
  pVVar3 = (HANDLE)ObtainCurrentThreadIdImpl(pThread,"MTX_InternalTryEnterCriticalSection");
  if (pCriticalSection->OwningThread == pVVar3) {
    pCriticalSection->RecursionCount = pCriticalSection->RecursionCount + 1;
    threadId._7_1_ = true;
  }
  else {
    iVar2 = pthread_mutex_trylock((pthread_mutex_t *)&pCriticalSection->csnds);
    threadId._7_1_ = iVar2 == 0;
    if (threadId._7_1_) {
      pCriticalSection->OwningThread = pVVar3;
      pCriticalSection->RecursionCount = 1;
    }
  }
  return threadId._7_1_;
}

Assistant:

bool MTX_InternalTryEnterCriticalSection(
        CPalThread * pThread,
        PCRITICAL_SECTION pCriticalSection)
#endif // MUTEX_BASED_CSS
    {
        PAL_CRITICAL_SECTION * pPalCriticalSection =
            reinterpret_cast<PAL_CRITICAL_SECTION*>(pCriticalSection);
        bool fRet;
        SIZE_T threadId;

        _ASSERTE(PalCsNotInitialized != pPalCriticalSection->cisInitState);

        threadId = ObtainCurrentThreadId(pThread);

        /* check if the current thread already owns the criticalSection */
        if (pPalCriticalSection->OwningThread == threadId)
        {
            pPalCriticalSection->RecursionCount += 1;
            fRet = true;
            goto ITECS_exit;
        }

        fRet = (0 == pthread_mutex_trylock(&pPalCriticalSection->csndNativeData.mutex));

        if (fRet)
        {
            pPalCriticalSection->OwningThread = threadId;
            pPalCriticalSection->RecursionCount = 1;
        }

    ITECS_exit:
        return fRet;
    }